

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

OrderCancelReplaceRequest * __thiscall
Application::queryCancelReplaceRequest41
          (OrderCancelReplaceRequest *__return_storage_ptr__,Application *this)

{
  bool bVar1;
  Header *header;
  OrderQty local_348;
  allocator<char> local_2e9;
  string local_2e8;
  Price local_2c8;
  allocator<char> local_269;
  string local_268;
  OrdType local_248;
  Side local_1f0;
  Symbol local_198;
  CHAR local_139;
  HandlInst local_138;
  ClOrdID local_d0;
  OrigClOrdID local_78;
  undefined1 local_19;
  Application *local_18;
  Application *this_local;
  OrderCancelReplaceRequest *cancelReplaceRequest;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Application *)__return_storage_ptr__;
  queryOrigClOrdID(&local_78,this);
  queryClOrdID(&local_d0,this);
  local_139 = '1';
  FIX::HandlInst::HandlInst(&local_138,&local_139);
  querySymbol(&local_198,this);
  querySide(&local_1f0,this);
  queryOrdType(&local_248,this);
  FIX41::OrderCancelReplaceRequest::OrderCancelReplaceRequest
            (__return_storage_ptr__,&local_78,&local_d0,&local_138,&local_198,&local_1f0,&local_248)
  ;
  FIX::OrdType::~OrdType(&local_248);
  FIX::Side::~Side(&local_1f0);
  FIX::Symbol::~Symbol(&local_198);
  FIX::HandlInst::~HandlInst(&local_138);
  FIX::ClOrdID::~ClOrdID(&local_d0);
  FIX::OrigClOrdID::~OrigClOrdID(&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"New price",&local_269);
  bVar1 = queryConfirm(this,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  if (bVar1) {
    queryPrice(&local_2c8,this);
    FIX41::OrderCancelReplaceRequest::set(__return_storage_ptr__,&local_2c8);
    FIX::Price::~Price(&local_2c8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"New quantity",&local_2e9)
  ;
  bVar1 = queryConfirm(this,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  if (bVar1) {
    queryOrderQty(&local_348,this);
    FIX41::OrderCancelReplaceRequest::set(__return_storage_ptr__,&local_348);
    FIX::OrderQty::~OrderQty(&local_348);
  }
  header = FIX41::Message::getHeader(&__return_storage_ptr__->super_Message);
  queryHeader(this,(Header *)header);
  return __return_storage_ptr__;
}

Assistant:

FIX41::OrderCancelReplaceRequest Application::queryCancelReplaceRequest41() {
  FIX41::OrderCancelReplaceRequest cancelReplaceRequest(
      queryOrigClOrdID(),
      queryClOrdID(),
      FIX::HandlInst('1'),
      querySymbol(),
      querySide(),
      queryOrdType());

  if (queryConfirm("New price")) {
    cancelReplaceRequest.set(queryPrice());
  }
  if (queryConfirm("New quantity")) {
    cancelReplaceRequest.set(queryOrderQty());
  }

  queryHeader(cancelReplaceRequest.getHeader());
  return cancelReplaceRequest;
}